

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O1

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,UnaryOperatorExpression *expression)

{
  ostream *poVar1;
  OperatorChar OVar2;
  Expression *pEVar3;
  OperatorChar local_44;
  string local_40;
  
  poVar1 = this->mStream;
  OVar2 = UnaryOperatorExpression::op(expression);
  local_44._0_2_ = OVar2._0_2_;
  local_44.mOp2 = OVar2.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_40,&local_44);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pEVar3 = UnaryOperatorExpression::operand(expression);
  (*pEVar3->_vptr_Expression[2])(pEVar3,this,expression);
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, UnaryOperatorExpression* expression) {
	mStream << expression->op().toString();
	expression->operand()->accept(*this, expression);
}